

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# code_generators.cpp
# Opt level: O1

void __thiscall flatbuffers::CodeWriter::operator+=(CodeWriter *this,string *text)

{
  size_type sVar1;
  ulong uVar2;
  ulong uVar3;
  iterator iVar4;
  ostream *poVar5;
  int iVar6;
  string key;
  key_type local_70;
  long *local_50 [2];
  long local_40 [2];
  
  if (((this->ignore_ident_ == false) && (text->_M_string_length != 0)) &&
     (iVar6 = this->cur_ident_lvl_, iVar6 != 0)) {
    do {
      std::ostream::write(&this->field_0x40,(long)(this->pad_)._M_dataplus._M_p);
      iVar6 = iVar6 + -1;
    } while (iVar6 != 0);
  }
  uVar2 = std::__cxx11::string::find((char *)text,0x3839bf,0);
  if (uVar2 != 0xffffffffffffffff) {
    do {
      uVar3 = std::__cxx11::string::find((char *)text,0x38323a,0);
      if ((uVar3 == 0xffffffffffffffff) || (uVar3 < uVar2)) break;
      std::ostream::write(&this->field_0x40,(long)(text->_M_dataplus)._M_p);
      std::__cxx11::string::substr((ulong)&local_70,(ulong)text);
      iVar4 = std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      *)this,&local_70);
      if ((_Rb_tree_header *)iVar4._M_node == &(this->value_map_)._M_t._M_impl.super__Rb_tree_header
         ) {
        __assert_fail("false && \"could not find key\"",
                      "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/src/code_generators.cpp"
                      ,0x58,"void flatbuffers::CodeWriter::operator+=(std::string)");
      }
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&this->field_0x40,*(char **)(iVar4._M_node + 2),
                 (long)iVar4._M_node[2]._M_parent);
      std::__cxx11::string::substr((ulong)local_50,(ulong)text);
      std::__cxx11::string::operator=((string *)text,(string *)local_50);
      if (local_50[0] != local_40) {
        operator_delete(local_50[0],local_40[0] + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != &local_70.field_2) {
        operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
      }
      uVar2 = std::__cxx11::string::find((char *)text,0x3839bf,0);
    } while (uVar2 != 0xffffffffffffffff);
  }
  sVar1 = text->_M_string_length;
  if ((sVar1 == 0) || ((text->_M_dataplus)._M_p[sVar1 - 1] != '\\')) {
    this->ignore_ident_ = false;
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&this->field_0x40,(text->_M_dataplus)._M_p,sVar1);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
    std::ostream::put((char)poVar5);
    std::ostream::flush();
  }
  else {
    std::__cxx11::string::pop_back();
    this->ignore_ident_ = true;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&this->field_0x40,(text->_M_dataplus)._M_p,text->_M_string_length);
  }
  return;
}

Assistant:

void CodeWriter::operator+=(std::string text) {
  if (!ignore_ident_ && !text.empty()) AppendIdent(stream_);

  while (true) {
    auto begin = text.find("{{");
    if (begin == std::string::npos) { break; }

    auto end = text.find("}}");
    if (end == std::string::npos || end < begin) { break; }

    // Write all the text before the first {{ into the stream.
    stream_.write(text.c_str(), begin);

    // The key is between the {{ and }}.
    const std::string key = text.substr(begin + 2, end - begin - 2);

    // Find the value associated with the key.  If it exists, write the
    // value into the stream, otherwise write the key itself into the stream.
    auto iter = value_map_.find(key);
    if (iter != value_map_.end()) {
      const std::string &value = iter->second;
      stream_ << value;
    } else {
      FLATBUFFERS_ASSERT(false && "could not find key");
      stream_ << key;
    }

    // Update the text to everything after the }}.
    text = text.substr(end + 2);
  }
  if (!text.empty() && text.back() == '\\') {
    text.pop_back();
    ignore_ident_ = true;
    stream_ << text;
  } else {
    ignore_ident_ = false;
    stream_ << text << std::endl;
  }
}